

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int erkStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                  ARKVecResizeFn resize,void *resize_data)

{
  void *pvVar1;
  int iVar2;
  long lrw_diff;
  long lVar3;
  long liw_diff;
  long lVar4;
  sunindextype liw1;
  sunindextype lrw1;
  long local_50;
  long local_48;
  ARKVecResizeFn local_40;
  void *local_38;
  
  pvVar1 = ark_mem->step_mem;
  local_40 = resize;
  local_38 = resize_data;
  if (pvVar1 == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError(ark_mem,-0x15,0x4c3,"erkStep_Resize",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    iVar2 = 0;
    local_50 = 0;
    local_48 = 0;
    if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(y0,&local_48,&local_50);
    }
    lrw_diff = local_48 - ark_mem->lrw1;
    liw_diff = local_50 - ark_mem->liw1;
    ark_mem->lrw1 = local_48;
    ark_mem->liw1 = local_50;
    if (0 < *(int *)((long)pvVar1 + 0x20)) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        iVar2 = arkResizeVec(ark_mem,local_40,local_38,lrw_diff,liw_diff,y0,
                             (N_Vector *)(*(long *)((long)pvVar1 + 0x10) + lVar4));
        if (iVar2 == 0) {
          arkProcessError(ark_mem,-0x14,0x100,"erkStep_Resize",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                          ,"Unable to resize vector");
          return -0x14;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 8;
      } while (lVar3 < *(int *)((long)pvVar1 + 0x20));
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int erkStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                   SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                   SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                   void* resize_data)
{
  ARKodeERKStepMem step_mem;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int i, retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the RHS vectors */
  for (i = 0; i < step_mem->stages; i++)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->F[i]))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  return (ARK_SUCCESS);
}